

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_ManCheckOverlap(Gia_Man_t *p,Vec_Wec_t *vGroups)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Vec_Int_t *p_00;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (0 < vGroups->nSize) {
    lVar7 = 0;
    do {
      uVar1 = vGroups->pArray[lVar7].nSize;
      uVar5 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        pVVar6 = vGroups->pArray + lVar7;
        lVar9 = 0;
        do {
          if ((int)uVar5 != 1) {
            iVar4 = pVVar6->pArray[lVar9];
            Gia_ManIncrementTravId(p);
            Str_MuxTraverse_rec(p,iVar4);
            uVar1 = pVVar6->nSize;
            if ((int)uVar1 < 1) {
              uVar5 = 0;
            }
            else {
              uVar5 = 0;
              do {
                iVar2 = pVVar6->pArray[uVar5];
                if (iVar4 != iVar2) {
                  if (p->nTravIdsAlloc <= iVar2) {
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  if (p->pTravIds[iVar2] == p->nTravIds) goto LAB_007d8cf8;
                }
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
              uVar5 = (ulong)uVar1;
            }
LAB_007d8cf8:
            if ((uint)uVar5 != uVar1) {
              iVar4 = pVVar6->nSize;
              if (1 < iVar4) {
                lVar8 = 1;
                do {
                  iVar4 = pVVar6->pArray[lVar8];
                  p_00 = Vec_WecPushLevel(vGroups);
                  if (vGroups->nSize <= lVar7) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                  }
                  pVVar3 = vGroups->pArray;
                  pVVar6 = pVVar3 + lVar7;
                  Vec_IntPush(p_00,iVar4);
                  lVar8 = lVar8 + 1;
                  iVar4 = pVVar3[lVar7].nSize;
                } while (lVar8 < iVar4);
              }
              if (iVar4 < 1) {
                __assert_fail("p->nSize >= nSizeNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
              }
              pVVar6->nSize = 1;
            }
          }
          lVar9 = lVar9 + 1;
          uVar5 = (ulong)pVVar6->nSize;
        } while (lVar9 < (long)uVar5);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vGroups->nSize);
  }
  return;
}

Assistant:

void Str_ManCheckOverlap( Gia_Man_t * p, Vec_Wec_t * vGroups )
{   // check that members of each group are not in the TFI of each other
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, n, iObj, iObj2;

//    vGroup = Vec_WecEntry(vGroups, 7);
//    Vec_IntForEachEntry( vGroup, iObj, n )
//        Gia_ManPrintCone2( p, Gia_ManObj(p, iObj) ), printf( "\n" );

    Vec_WecForEachLevel( vGroups, vGroup, i )
    Vec_IntForEachEntry( vGroup, iObj, k )
    {
        if ( Vec_IntSize(vGroup) == 1 )
            continue;
        // high light the cone
        Gia_ManIncrementTravId( p );
        Str_MuxTraverse_rec( p, iObj );
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj2, n )
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                break;
        if ( n == Vec_IntSize(vGroup) )
            continue;
        // split the group into individual trees
        Vec_IntForEachEntryStart( vGroup, iObj2, n, 1 )
        {
            vGroup2 = Vec_WecPushLevel( vGroups );
            vGroup  = Vec_WecEntry( vGroups, i );
            Vec_IntPush( vGroup2, iObj2 );
        }
        Vec_IntShrink( vGroup, 1 );

/*
        // this does not work because there can be a pair of independent trees
        // with another tree squeezed in between them, so that there is a combo loop

        // divide this group
        nNew = 0;
        vGroup2 = Vec_WecPushLevel( vGroups );
        vGroup  = Vec_WecEntry( vGroups, i );
        Vec_IntForEachEntry( vGroup, iObj2, n )
        {
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                Vec_IntPush( vGroup2, iObj2 );
            else
                Vec_IntWriteEntry( vGroup, nNew++, iObj2 );
        }
        Vec_IntShrink( vGroup, nNew );
        i--;
        break;
*/

/*
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj, n )
            if ( n != k && Gia_ObjIsTravIdCurrentId(p, iObj) )
            {
                printf( "Overlap of TFI cones of trees %d and %d in group %d of size %d!\n", k, n, i, Vec_IntSize(vGroup) );
                Vec_IntShrink( vGroup, 1 );
                break;
            }
*/
    }
}